

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamToolsIndex::WriteReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  IBamIODevice *pIVar1;
  pointer pBVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  pointer block;
  uint32_t numBlocks;
  uint local_6c;
  string local_68;
  string local_48;
  
  iVar3 = (int)((ulong)((long)(refEntry->Blocks).
                              super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(refEntry->Blocks).
                             super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_6c = iVar3 * -0x55555555;
  if (this->m_isBigEndian == true) {
    local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
               iVar3 * -0x55000000;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var,iVar3) == 4) {
    pBVar2 = (refEntry->Blocks).
             super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (block = (refEntry->Blocks).
                 super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                 ._M_impl.super__Vector_impl_data._M_start; block != pBVar2; block = block + 1) {
      WriteBlock(this,block);
    }
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamToolsIndex::WriteReferenceEntry","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not write number of blocks","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteReferenceEntry(const BtiReferenceEntry& refEntry)
{

    // write number of blocks this reference
    uint32_t numBlocks = refEntry.Blocks.size();
    if (m_isBigEndian) SwapEndian_32(numBlocks);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&numBlocks, sizeof(numBlocks));
    if (numBytesWritten != sizeof(numBlocks))
        throw BamException("BamToolsIndex::WriteReferenceEntry",
                           "could not write number of blocks");

    // write actual block entries
    WriteBlocks(refEntry.Blocks);
}